

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::Matcher
          (Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this,
          pair<int,_phmap::priv::NonStandardLayout> *value)

{
  pair<int,_phmap::priv::NonStandardLayout> *x;
  pair<int,_phmap::priv::NonStandardLayout> local_90;
  EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> local_60;
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> local_30;
  pair<int,_phmap::priv::NonStandardLayout> *local_18;
  pair<int,_phmap::priv::NonStandardLayout> *value_local;
  Matcher<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *this_local;
  
  local_18 = value;
  value_local = (pair<int,_phmap::priv::NonStandardLayout> *)this;
  internal::MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>);
  (this->super_MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00493588;
  std::pair<int,_phmap::priv::NonStandardLayout>::pair(&local_90,local_18);
  Eq<std::pair<int,phmap::priv::NonStandardLayout>>(&local_60,(testing *)&local_90,x);
  Matcher<std::pair<int,phmap::priv::NonStandardLayout>const&>::
  Matcher<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,void>
            ((Matcher<std::pair<int,phmap::priv::NonStandardLayout>const&> *)&local_30,&local_60);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>::~EqMatcher(&local_60);
  std::pair<int,_phmap::priv::NonStandardLayout>::~pair(&local_90);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}